

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitCallTarget(ParseNode *pnodeTarget,BOOL fSideEffectArgs,RegSlot *thisLocation,
                   bool *releaseThisLocation,RegSlot *callObjLocation,
                   ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                   ProfileId *callApplyCallSiteId)

{
  undefined1 *puVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  PropertyId PVar5;
  RegSlot objReg;
  RegSlot RVar6;
  RegSlot RVar7;
  uint uVar8;
  ParseNodeBin *pPVar9;
  undefined4 *puVar10;
  ParseNodeName *pPVar11;
  ParseNodeBin *pPVar12;
  ParseNodeSuperReference *pPVar13;
  uint16 uVar14;
  ParseNodePtr this;
  
  *releaseThisLocation = true;
  OVar2 = pnodeTarget->nop;
  if (OVar2 == knopName) {
    pPVar11 = ParseNode::AsParseNodeName(pnodeTarget);
    if (pPVar11->isSpecialName == false) {
      FuncInfo::AcquireLoc(funcInfo,&pPVar11->super_ParseNode);
      if (fSideEffectArgs != 0) {
        SaveOpndValue(&pPVar11->super_ParseNode,funcInfo);
      }
      ByteCodeGenerator::EmitLoadInstance
                (byteCodeGenerator,pPVar11->sym,pPVar11->pid,thisLocation,callObjLocation,funcInfo);
      if (*callObjLocation != 0xffffffff) {
        PVar5 = ParseNodeName::PropertyIdFromNameNode(pPVar11);
        EmitMethodFld(&pPVar11->super_ParseNode,*callObjLocation,PVar5,byteCodeGenerator,funcInfo,
                      true);
        goto LAB_0081022a;
      }
    }
LAB_00810052:
    Emit(pnodeTarget,byteCodeGenerator,funcInfo,0,false,false);
    RVar7 = funcInfo->undefinedConstantRegister;
    *thisLocation = RVar7;
  }
  else {
    if (OVar2 == knopIndex) {
      FuncInfo::AcquireLoc(funcInfo,pnodeTarget);
      if (fSideEffectArgs == 0) {
        pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
        uVar8 = ParseNode::Grfnop((uint)pPVar9->pnode2->nop);
        if ((uVar8 & 2) == 0) goto LAB_0080fee9;
      }
      else {
LAB_0080fee9:
        pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
        SaveOpndValue(pPVar9->pnode1,funcInfo);
      }
      pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
      Emit(pPVar9->pnode1,byteCodeGenerator,funcInfo,0,false,false);
      pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
      Emit(pPVar9->pnode2,byteCodeGenerator,funcInfo,0,false,false);
      pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
      RVar7 = pPVar9->pnode2->location;
      pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
      objReg = pPVar9->pnode1->location;
      pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
      bVar4 = ByteCodeGenerator::IsSuper(pPVar9->pnode1);
      if (bVar4) {
        pPVar13 = ParseNode::AsParseNodeSuperReference(pnodeTarget);
        Emit((ParseNode *)pPVar13->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
        objReg = ByteCodeGenerator::EmitLdObjProto(byteCodeGenerator,LdHomeObjProto,objReg,funcInfo)
        ;
        pPVar13 = ParseNode::AsParseNodeSuperReference(pnodeTarget);
        FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar13->pnodeThis);
        pPVar13 = ParseNode::AsParseNodeSuperReference(pnodeTarget);
        RVar6 = (pPVar13->pnodeThis->super_ParseNodeName).super_ParseNode.location;
        *releaseThisLocation = false;
      }
      else {
        pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
        RVar6 = pPVar9->pnode1->location;
      }
      *thisLocation = RVar6;
      Js::ByteCodeWriter::Element
                (&byteCodeGenerator->m_writer,LdMethodElem,pnodeTarget->location,objReg,RVar7,false,
                 false);
      pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
      FuncInfo::ReleaseLoc(funcInfo,pPVar9->pnode2);
      pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
      bVar4 = ByteCodeGenerator::IsSuper(pPVar9->pnode1);
      if (bVar4) {
        pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
        FuncInfo::ReleaseLoc(funcInfo,pPVar9->pnode1);
      }
    }
    else {
      if (OVar2 != knopDot) goto LAB_00810052;
      pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
      FuncInfo::AcquireLoc(funcInfo,&pPVar9->super_ParseNode);
      if (fSideEffectArgs != 0) {
        SaveOpndValue(pPVar9->pnode1,funcInfo);
      }
      this = pPVar9->pnode2;
      if (this->nop != knopName) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1f89,"(pnodeBinTarget->pnode2->nop == knopName)",
                           "pnodeBinTarget->pnode2->nop == knopName");
        if (!bVar4) goto LAB_00810292;
        *puVar10 = 0;
        this = pPVar9->pnode2;
      }
      pPVar11 = ParseNode::AsParseNodeName(this);
      PVar5 = ParseNodeName::PropertyIdFromNameNode(pPVar11);
      if (PVar5 == 0x4e) {
LAB_0080fe73:
        FuncInfo::EnsureCallSiteToCallApplyCallSiteMap(funcInfo);
        bVar4 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(&byteCodeGenerator->m_writer,CallI);
        uVar14 = byteCodeGenerator->m_callApplyCallSiteCount;
        if (bVar4) {
          if (uVar14 == 0xffff) {
            uVar14 = 0xffff;
          }
          else {
            byteCodeGenerator->m_callApplyCallSiteCount = uVar14 + 1;
          }
        }
        *callApplyCallSiteId = uVar14;
        puVar1 = &pPVar9->pnode1->field_0x1;
        *puVar1 = *puVar1 | 8;
      }
      else {
        pPVar12 = ParseNode::AsParseNodeBin(pnodeTarget);
        pPVar11 = ParseNode::AsParseNodeName(pPVar12->pnode2);
        PVar5 = ParseNodeName::PropertyIdFromNameNode(pPVar11);
        if (PVar5 == 0x5a) goto LAB_0080fe73;
      }
      Emit(pPVar9->pnode1,byteCodeGenerator,funcInfo,0,false,false);
      pPVar11 = ParseNode::AsParseNodeName(pPVar9->pnode2);
      PVar5 = ParseNodeName::PropertyIdFromNameNode(pPVar11);
      RVar7 = pPVar9->pnode1->location;
      bVar4 = ByteCodeGenerator::IsSuper(pPVar9->pnode1);
      if (bVar4) {
        pPVar13 = ParseNode::AsParseNodeSuperReference(&pPVar9->super_ParseNode);
        Emit((ParseNode *)pPVar13->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
        RVar7 = ByteCodeGenerator::EmitLdObjProto(byteCodeGenerator,LdHomeObjProto,RVar7,funcInfo);
        pPVar13 = ParseNode::AsParseNodeSuperReference(&pPVar9->super_ParseNode);
        FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar13->pnodeThis);
        FuncInfo::ReleaseLoc(funcInfo,pPVar9->pnode1);
        pPVar13 = ParseNode::AsParseNodeSuperReference(&pPVar9->super_ParseNode);
        *thisLocation = (pPVar13->pnodeThis->super_ParseNodeName).super_ParseNode.location;
        *releaseThisLocation = false;
        uVar8 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar7,PVar5,false,false);
        Js::ByteCodeWriter::PatchablePropertyWithThisPtr
                  (&byteCodeGenerator->m_writer,LdSuperFld,pnodeTarget->location,RVar7,*thisLocation
                   ,uVar8,false,true);
      }
      else {
        *thisLocation = pPVar9->pnode1->location;
        EmitMethodFld(&pPVar9->super_ParseNode,RVar7,PVar5,byteCodeGenerator,funcInfo,true);
      }
    }
LAB_0081022a:
    RVar7 = *thisLocation;
  }
  if (RVar7 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1ffb,"(*thisLocation != Js::Constants::NoRegister)",
                       "*thisLocation != Js::Constants::NoRegister");
    if (!bVar4) {
LAB_00810292:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  return;
}

Assistant:

void EmitCallTarget(
    ParseNode *pnodeTarget,
    BOOL fSideEffectArgs,
    Js::RegSlot *thisLocation,
    bool *releaseThisLocation,
    Js::RegSlot *callObjLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId * callApplyCallSiteId)
{
    // - emit target
    //    - assign this
    // - emit args
    // - do call

    // The call target is fully evaluated before the argument list. Note that we're not handling
    // put-call cases here currently, as such cases only apply to host objects
    // and are very unlikely to behave differently depending on the order of evaluation.

    *releaseThisLocation = true;

    switch (pnodeTarget->nop)
    {
    case knopDot:
    {
        ParseNodeBin * pnodeBinTarget = pnodeTarget->AsParseNodeBin();
        funcInfo->AcquireLoc(pnodeBinTarget);
        // Assign the call target operand(s), putting them into expression temps if necessary to protect
        // them from side-effects.
        if (fSideEffectArgs)
        {
            // Though we're done with target evaluation after this point, still protect opnd1 from
            // arg side-effects as it's the "this" pointer.
            SaveOpndValue(pnodeBinTarget->pnode1, funcInfo);
        }

        Assert(pnodeBinTarget->pnode2->nop == knopName);
        if ((pnodeBinTarget->pnode2->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::apply) || (pnodeTarget->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::call))
        {
            funcInfo->EnsureCallSiteToCallApplyCallSiteMap();
            
            *callApplyCallSiteId = byteCodeGenerator->GetNextCallApplyCallSiteId(Js::OpCode::CallI);
            pnodeBinTarget->pnode1->SetIsCallApplyTargetLoad();
        }

        Emit(pnodeBinTarget->pnode1, byteCodeGenerator, funcInfo, false);
        Js::PropertyId propertyId = pnodeBinTarget->pnode2->AsParseNodeName()->PropertyIdFromNameNode();
        Js::RegSlot protoLocation = pnodeBinTarget->pnode1->location;

        if (ByteCodeGenerator::IsSuper(pnodeBinTarget->pnode1))
        {
            Emit(pnodeBinTarget->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            protoLocation = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, protoLocation, funcInfo);
            funcInfo->ReleaseLoc(pnodeBinTarget->AsParseNodeSuperReference()->pnodeThis);
            funcInfo->ReleaseLoc(pnodeBinTarget->pnode1);

            // Function calls on the 'super' object should maintain current 'this' pointer.
            *thisLocation = pnodeBinTarget->AsParseNodeSuperReference()->pnodeThis->location;
            *releaseThisLocation = false;

            uint cacheId = funcInfo->FindOrAddInlineCacheId(protoLocation, propertyId, false, false);
            byteCodeGenerator->Writer()->PatchablePropertyWithThisPtr(Js::OpCode::LdSuperFld,
                pnodeTarget->location, protoLocation, *thisLocation, cacheId, false);
        }
        else
        {
            *thisLocation = pnodeBinTarget->pnode1->location;
            EmitMethodFld(pnodeBinTarget, protoLocation, propertyId, byteCodeGenerator, funcInfo);
        }

        break;
    }

    case knopIndex:
    {
        funcInfo->AcquireLoc(pnodeTarget);
        // Assign the call target operand(s), putting them into expression temps if necessary to protect
        // them from side-effects.
        if (fSideEffectArgs || !(ParseNode::Grfnop(pnodeTarget->AsParseNodeBin()->pnode2->nop) & fnopLeaf))
        {
            // Though we're done with target evaluation after this point, still protect opnd1 from
            // arg or opnd2 side-effects as it's the "this" pointer.
            SaveOpndValue(pnodeTarget->AsParseNodeBin()->pnode1, funcInfo);
        }
        Emit(pnodeTarget->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
        Emit(pnodeTarget->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo, false);

        Js::RegSlot indexLocation = pnodeTarget->AsParseNodeBin()->pnode2->location;
        Js::RegSlot protoLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;

        if (ByteCodeGenerator::IsSuper(pnodeTarget->AsParseNodeBin()->pnode1))
        {
            Emit(pnodeTarget->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            protoLocation = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, protoLocation, funcInfo);
            funcInfo->ReleaseLoc(pnodeTarget->AsParseNodeSuperReference()->pnodeThis);

            // Function calls on the 'super' object should maintain current 'this' pointer
            *thisLocation = pnodeTarget->AsParseNodeSuperReference()->pnodeThis->location;
            *releaseThisLocation = false;
        }
        else
        {
            *thisLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;
        }

        EmitMethodElem(pnodeTarget, protoLocation, indexLocation, byteCodeGenerator);

        funcInfo->ReleaseLoc(pnodeTarget->AsParseNodeBin()->pnode2); // don't release indexLocation until after we use it.

        if (ByteCodeGenerator::IsSuper(pnodeTarget->AsParseNodeBin()->pnode1))
        {
            funcInfo->ReleaseLoc(pnodeTarget->AsParseNodeBin()->pnode1);
        }
        break;
    }

    case knopName:
    {
        ParseNodeName * pnodeNameTarget = pnodeTarget->AsParseNodeName();
        if (!pnodeNameTarget->IsSpecialName())
        {
            funcInfo->AcquireLoc(pnodeNameTarget);
            // Assign the call target operand(s), putting them into expression temps if necessary to protect
            // them from side-effects.
            if (fSideEffectArgs)
            {
                SaveOpndValue(pnodeNameTarget, funcInfo);
            }
            byteCodeGenerator->EmitLoadInstance(pnodeNameTarget->sym, pnodeNameTarget->pid, thisLocation, callObjLocation, funcInfo);
            if (*callObjLocation != Js::Constants::NoRegister)
            {
                // Load the call target as a property of the instance.
                Js::PropertyId propertyId = pnodeNameTarget->PropertyIdFromNameNode();
                EmitMethodFld(pnodeNameTarget, *callObjLocation, propertyId, byteCodeGenerator, funcInfo);
                break;
            }
        }

        // FALL THROUGH to evaluate call target.
    }

    default:
        // Assign the call target operand(s), putting them into expression temps if necessary to protect
        // them from side-effects.
        Emit(pnodeTarget, byteCodeGenerator, funcInfo, false);
        *thisLocation = funcInfo->undefinedConstantRegister;
        break;
    }

    // "This" pointer should have been assigned by the above.
    Assert(*thisLocation != Js::Constants::NoRegister);
}